

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_cleanup(int n,...)

{
  char in_AL;
  uint uVar1;
  void *__ptr;
  undefined8 in_RCX;
  ulong uVar2;
  undefined8 in_RDX;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = in_RSI;
  local_c8[2] = in_RDX;
  local_c8[3] = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  __ptr = malloc((long)n * 8);
  puVar3 = (undefined8 *)&stack0x00000008;
  uVar1 = 8;
  uVar2 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar2;
  }
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    if (uVar1 < 0x29) {
      uVar4 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      puVar5 = (undefined8 *)((long)local_c8 + uVar4);
    }
    else {
      puVar5 = puVar3;
      puVar3 = puVar3 + 1;
    }
    *(undefined8 *)((long)__ptr + uVar2 * 8) = *puVar5;
  }
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    mpc_undefine(*(mpc_parser_t **)((long)__ptr + uVar2 * 8));
  }
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    mpc_delete(*(mpc_parser_t **)((long)__ptr + uVar2 * 8));
  }
  free(__ptr);
  return;
}

Assistant:

void mpc_cleanup(int n, ...) {
  int i;
  mpc_parser_t **list = malloc(sizeof(mpc_parser_t*) * n);

  va_list va;
  va_start(va, n);
  for (i = 0; i < n; i++) { list[i] = va_arg(va, mpc_parser_t*); }
  for (i = 0; i < n; i++) { mpc_undefine(list[i]); }
  for (i = 0; i < n; i++) { mpc_delete(list[i]); }
  va_end(va);

  free(list);
}